

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_node *pxVar1;
  xpath_ast_node *this_00;
  xml_attribute_struct *pxVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  size_t size;
  size_t sVar6;
  xpath_node *it;
  xpath_node *pxVar7;
  xpath_node *pxVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  xpath_context c;
  xpath_context local_58;
  
  pxVar1 = ns->_end;
  sVar6 = ((long)pxVar1 - (long)ns->_begin >> 4) - first;
  if (sVar6 != 0) {
    this_00 = this->_right;
    pxVar7 = ns->_begin + first;
    if ((this->_test & 0xfeU) == 2) {
      local_58.n._node._root = (xml_node_struct *)0x0;
      local_58.n._attribute._attr = (xml_attribute_struct *)0x0;
      local_58.position = 1;
      local_58.size = sVar6;
      dVar9 = eval_number(this_00,&local_58,stack);
      if ((1.0 <= dVar9) &&
         (auVar10._8_4_ = (int)(sVar6 >> 0x20), auVar10._0_8_ = sVar6, auVar10._12_4_ = 0x45300000,
         dVar9 <= (auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0))) {
        uVar4 = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
        auVar11._8_4_ = (int)(uVar4 >> 0x20);
        auVar11._0_8_ = uVar4;
        auVar11._12_4_ = 0x45300000;
        dVar13 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
        if ((dVar9 == dVar13) && (!NAN(dVar9) && !NAN(dVar13))) {
          pxVar2 = pxVar7[uVar4 - 1]._attribute._attr;
          (pxVar7->_node)._root = pxVar7[uVar4 - 1]._node._root;
          (pxVar7->_attribute)._attr = pxVar2;
          pxVar7 = pxVar7 + 1;
        }
      }
      ns->_end = pxVar7;
    }
    else {
      pxVar8 = pxVar7;
      if (this_00->_rettype == '\x02') {
        if (pxVar7 != pxVar1) {
          sVar5 = 1;
          do {
            local_58.n._node._root = (pxVar7->_node)._root;
            local_58.n._attribute._attr = (pxVar7->_attribute)._attr;
            local_58.position = sVar5;
            local_58.size = sVar6;
            dVar9 = eval_number(this_00,&local_58,stack);
            auVar12._8_4_ = (int)(sVar5 >> 0x20);
            auVar12._0_8_ = sVar5;
            auVar12._12_4_ = 0x45300000;
            dVar13 = (auVar12._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0);
            if ((dVar9 == dVar13) && (!NAN(dVar9) && !NAN(dVar13))) {
              pxVar2 = (pxVar7->_attribute)._attr;
              (pxVar8->_node)._root = (pxVar7->_node)._root;
              (pxVar8->_attribute)._attr = pxVar2;
              pxVar8 = pxVar8 + 1;
              if (once) break;
            }
            pxVar7 = pxVar7 + 1;
            sVar5 = sVar5 + 1;
          } while (pxVar7 != ns->_end);
        }
      }
      else if (pxVar7 != pxVar1) {
        sVar5 = 1;
        do {
          local_58.n._node._root = (pxVar7->_node)._root;
          local_58.n._attribute._attr = (pxVar7->_attribute)._attr;
          local_58.position = sVar5;
          local_58.size = sVar6;
          bVar3 = eval_boolean(this_00,&local_58,stack);
          if (bVar3) {
            pxVar2 = (pxVar7->_attribute)._attr;
            (pxVar8->_node)._root = (pxVar7->_node)._root;
            (pxVar8->_attribute)._attr = pxVar2;
            pxVar8 = pxVar8 + 1;
            if (once) break;
          }
          pxVar7 = pxVar7 + 1;
          sVar5 = sVar5 + 1;
        } while (pxVar7 != ns->_end);
      }
      ns->_end = pxVar8;
    }
  }
  return;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}